

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::execute_simple_merge(int *argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string export_path;
  geofile primary_geofile;
  geofile secondary_geofile;
  allocator<char> local_569;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_568;
  long local_560;
  size_type local_558 [2];
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  geofile local_408;
  geofile local_210;
  
  if (*argc != 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Expected 5 arguments, got ",0x21);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*argc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  GEO::geofile::geofile(&local_408);
  GEO::geofile::geofile(&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,argv[3],(allocator<char> *)&local_568);
  iVar1 = GEO::geofile::import_geofile(&local_408,&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == 0) {
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4a8,"Imported primary geometry file successfully.","");
    print_ln(&local_4a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,argv[4],(allocator<char> *)&local_568);
    iVar1 = GEO::geofile::import_geofile(&local_210,&local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 == 0) {
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4c8,"Imported secondary geometry file successfully.","");
      print_ln(&local_4c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      iVar1 = GEO::geofile::merge_with(&local_408,&local_210);
      if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,argv[5],&local_569);
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4e8,local_568,local_568->_M_local_buf + local_560);
        iVar1 = GEO::geofile::export_geofile(&local_408,&local_4e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if (iVar1 == 0) {
          paVar4 = &local_468.field_2;
          local_468._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_468,"Export returned success.","");
          print_ln(&local_468);
          _Var3._M_p = local_468._M_dataplus._M_p;
        }
        else {
          paVar4 = &local_488.field_2;
          local_488._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_488,"Export returned failure.","");
          print_ln(&local_488);
          _Var3._M_p = local_488._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != paVar4) {
          operator_delete(_Var3._M_p,paVar4->_M_allocated_capacity + 1);
        }
        if (local_568 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558) goto LAB_0010e600;
      }
      else {
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_508,"Error: Merge Operation Failed.","");
        print_ln(&local_508);
        local_558[0] = local_508.field_2._M_allocated_capacity;
        local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_508._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p == &local_508.field_2) goto LAB_0010e600;
      }
    }
    else {
      local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_528,"Error: Import of second file failed.","");
      print_ln(&local_528);
      local_558[0] = local_528.field_2._M_allocated_capacity;
      local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p == &local_528.field_2) goto LAB_0010e600;
    }
  }
  else {
    local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_548,"Error: Import of first file failed.","");
    print_ln(&local_548);
    local_558[0] = local_548.field_2._M_allocated_capacity;
    local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p == &local_548.field_2) goto LAB_0010e600;
  }
  operator_delete(local_568,local_558[0] + 1);
LAB_0010e600:
  GEO::geofile::~geofile(&local_210);
  GEO::geofile::~geofile(&local_408);
  return;
}

Assistant:

void UI::execute_simple_merge(int &argc, char *argv[])
{
    if ( argc == 6 )
    {
        GEO::geofile primary_geofile, secondary_geofile;
        if ( primary_geofile.import_geofile(argv[3]) == EXIT_SUCCESS )
        {
            print_ln("Imported primary geometry file successfully.");
            if(secondary_geofile.import_geofile(argv[4]) == EXIT_SUCCESS)
            {
                print_ln("Imported secondary geometry file successfully.");
                if (primary_geofile.merge_with(secondary_geofile)==EXIT_SUCCESS)
                {
                    std::string export_path = argv[5];
                    if(primary_geofile.export_geofile(export_path)==EXIT_SUCCESS)
                        print_ln("Export returned success.");
                    else
                        print_ln("Export returned failure.");
                }
                else
                {
                    print_ln("Error: Merge Operation Failed.");
                }
            }
            else
            {
                print_ln("Error: Import of second file failed.");
            }
        }
        else
        {
            print_ln("Error: Import of first file failed.");
        }
    }
    else
    {
        std::cout << "Error: Expected 5 arguments, got " << argc << "." << std::endl;
    }

}